

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanim.cpp
# Opt level: O2

HAnimHierarchy *
rw::HAnimHierarchy::create
          (int32 numNodes,int32 *nodeFlags,int32 *nodeIDs,int32 flags,int32 maxKeySize)

{
  FILE *__stream;
  HAnimHierarchy *pHVar1;
  AnimInterpolator *pAVar2;
  void *pvVar3;
  HAnimNodeInfo *pHVar4;
  Frame **ppFVar5;
  char *pcVar6;
  Matrix *pMVar7;
  ulong uVar8;
  int32 iVar9;
  int32 iVar10;
  ulong uVar11;
  Error _e;
  
  allocLocation =
       "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/hanim.cpp line: 33";
  pHVar1 = (HAnimHierarchy *)(*Engine::memfuncs)(0x38,0x3011e);
  if (pHVar1 == (HAnimHierarchy *)0x0) {
    _e.plugin = 0x11e;
    _e.code = 0x80000002;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/hanim.cpp",0x23);
    __stream = _stderr;
    pcVar6 = dbgsprint(0x80000002,0x38);
    fprintf(__stream,"%s\n",pcVar6);
    setError(&_e);
  }
  else {
    pAVar2 = AnimInterpolator::create(numNodes,maxKeySize);
    pHVar1->interpolator = pAVar2;
    pHVar1->numNodes = numNodes;
    pHVar1->flags = flags;
    pHVar1->parentFrame = (Frame *)0x0;
    pHVar1->parentHierarchy = pHVar1;
    uVar11 = 0;
    if ((flags & 2U) == 0) {
      allocLocation =
           "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/hanim.cpp line: 48"
      ;
      pvVar3 = (void *)(*DAT_00144da8)((long)(int)(numNodes << 6 | 0xf),0x3011e);
      pMVar7 = (Matrix *)((long)pvVar3 + 0xfU & 0xfffffffffffffff0);
      numNodes = pHVar1->numNodes;
    }
    else {
      pvVar3 = (void *)0x0;
      pMVar7 = (Matrix *)0x0;
    }
    pHVar1->matricesUnaligned = pvVar3;
    pHVar1->matrices = pMVar7;
    allocLocation =
         "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/hanim.cpp line: 52"
    ;
    pHVar4 = (HAnimNodeInfo *)(*DAT_00144da8)((long)numNodes * 0x18,0x3011e);
    pHVar1->nodeInfo = pHVar4;
    uVar8 = (ulong)(uint)pHVar1->numNodes;
    if (pHVar1->numNodes < 1) {
      uVar8 = uVar11;
    }
    ppFVar5 = &pHVar4->frame;
    for (; uVar8 != uVar11; uVar11 = uVar11 + 1) {
      iVar9 = 0;
      iVar10 = 0;
      if (nodeIDs != (int32 *)0x0) {
        iVar10 = nodeIDs[uVar11];
      }
      ((HAnimNodeInfo *)(ppFVar5 + -2))->id = iVar10;
      *(int32 *)((long)ppFVar5 + -0xc) = (int32)uVar11;
      if (nodeFlags != (int32 *)0x0) {
        iVar9 = nodeFlags[uVar11];
      }
      *(int32 *)(ppFVar5 + -1) = iVar9;
      *ppFVar5 = (Frame *)0x0;
      ppFVar5 = ppFVar5 + 3;
    }
  }
  return pHVar1;
}

Assistant:

HAnimHierarchy*
HAnimHierarchy::create(int32 numNodes, int32 *nodeFlags, int32 *nodeIDs,
                       int32 flags, int32 maxKeySize)
{
	HAnimHierarchy *hier = (HAnimHierarchy*)rwMalloc(sizeof(*hier), MEMDUR_EVENT | ID_HANIM);
	if(hier == nil){
		RWERROR((ERR_ALLOC, sizeof(*hier)));
		return nil;
	}
	hier->interpolator = AnimInterpolator::create(numNodes, maxKeySize);

	hier->numNodes = numNodes;
	hier->flags = flags;
	hier->parentFrame = nil;
	hier->parentHierarchy = hier;
	if(hier->flags & NOMATRICES){
		hier->matrices = nil;
		hier->matricesUnaligned = nil;
	}else{
		hier->matricesUnaligned = rwNew(hier->numNodes*64 + 0xF, MEMDUR_EVENT | ID_HANIM);
		hier->matrices =
		  (Matrix*)(((uintptr)hier->matricesUnaligned + 0xF) & ~0xF);
	}
	hier->nodeInfo = rwNewT(HAnimNodeInfo, hier->numNodes, MEMDUR_EVENT | ID_HANIM);
	for(int32 i = 0; i < hier->numNodes; i++){
		if(nodeIDs)
			hier->nodeInfo[i].id = nodeIDs[i];
		else
			hier->nodeInfo[i].id = 0;
		hier->nodeInfo[i].index = i;
		if(nodeFlags)
			hier->nodeInfo[i].flags = nodeFlags[i];
		else
			hier->nodeInfo[i].flags = 0;
		hier->nodeInfo[i].frame = nil;
	}
	return hier;
}